

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O1

void mzd_mul_v_s256_192_1024(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  uint w;
  int iVar1;
  mzd_local_t *pmVar2;
  uint i;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  local_c0 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_100 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  iVar1 = 3;
  do {
    iVar3 = 0x40;
    do {
      pmVar2 = A;
      auVar5 = vpbroadcastq_avx512vl();
      lVar4 = 0;
      do {
        auVar6 = vpternlogq_avx512vl(*(undefined1 (*) [32])((long)pmVar2->w64 + lVar4),auVar5,
                                     *(undefined1 (*) [32])(local_100 + lVar4),0x6a);
        *(undefined1 (*) [32])(local_100 + lVar4) = auVar6;
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != 0x80);
      iVar3 = iVar3 + -1;
      A = pmVar2 + 4;
    } while (iVar3 != 0);
    A = pmVar2 + 4;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  c[2].w64[0] = local_c0._0_8_;
  c[2].w64[1] = local_c0._8_8_;
  c[2].w64[2] = local_c0._16_8_;
  c[2].w64[3] = local_c0._24_8_;
  c[3].w64[0] = local_c0._32_8_;
  c[3].w64[1] = local_c0._40_8_;
  c[3].w64[2] = local_c0._48_8_;
  c[3].w64[3] = local_c0._56_8_;
  c->w64[0] = local_100._0_8_;
  c->w64[1] = local_100._8_8_;
  c->w64[2] = local_100._16_8_;
  c->w64[3] = local_100._24_8_;
  c[1].w64[0] = local_100._32_8_;
  c[1].w64[1] = local_100._40_8_;
  c[1].w64[2] = local_100._48_8_;
  c[1].w64[3] = local_100._56_8_;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_mul_v_s256_192_1024(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[4] = {mm256_zero, mm256_zero, mm256_zero, mm256_zero};
  for (unsigned int w = 3; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 1, idx >>= 1) {
      const word256 mask = mm256_compute_mask(idx, 0);
      for (unsigned int j = 0; j < 4; ++j, ++Ablock) {
        cval[j] = mm256_xor_mask(cval[j], mm256_load(Ablock->w64), mask);
      }
    }
  }

  for (unsigned int j = 0; j < 4; ++j) {
    mm256_store(BLOCK(c, j)->w64, cval[j]);
  }
}